

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

void __thiscall FastRandomContext::Reseed(FastRandomContext *this,uint256 *seed)

{
  long lVar1;
  ChaCha20 *pCVar2;
  ChaCha20 *pCVar3;
  long in_FS_OFFSET;
  byte bVar4;
  Span<const_std::byte> key;
  ChaCha20 local_94;
  long local_20;
  
  bVar4 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_RandomMixin<FastRandomContext>).bitbuf = 0;
  (this->super_RandomMixin<FastRandomContext>).bitbuf_size = 0;
  (this->super_RandomMixin<FastRandomContext>).field_0xc = 0;
  key.m_size = 0x20;
  key.m_data = (byte *)seed;
  ChaCha20Aligned::ChaCha20Aligned(&local_94.m_aligned,key);
  local_94.m_bufleft = 0;
  pCVar2 = &local_94;
  pCVar3 = &this->rng;
  for (lVar1 = 0x1d; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pCVar3->m_aligned).input[0] = (pCVar2->m_aligned).input[0];
    pCVar2 = (ChaCha20 *)((long)pCVar2 + (ulong)bVar4 * -8 + 4);
    pCVar3 = (ChaCha20 *)((long)pCVar3 + (ulong)bVar4 * -8 + 4);
  }
  ChaCha20::~ChaCha20(&local_94);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FastRandomContext::Reseed(const uint256& seed) noexcept
{
    FlushCache();
    requires_seed = false;
    rng = {MakeByteSpan(seed)};
}